

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_timedwait.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_DISPLAY *dpy;
  ALLEGRO_EVENT_QUEUE *in_stack_00000030;
  ALLEGRO_EVENT_QUEUE *in_stack_00000040;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  lVar2 = al_create_display(0x280,0x1e0);
  if (lVar2 == 0) {
    abort_example("Unable to set any graphic mode\n");
  }
  uVar3 = al_create_event_queue();
  uVar4 = al_get_keyboard_event_source();
  al_register_event_source(uVar3,uVar4);
  test_relative_timeout(in_stack_00000030);
  test_absolute_timeout(in_stack_00000040);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *dpy;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();

   dpy = al_create_display(640, 480);
   if (!dpy) {
      abort_example("Unable to set any graphic mode\n");
   }

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   test_relative_timeout(queue);
   test_absolute_timeout(queue);

   return 0;
}